

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedGraph.h
# Opt level: O0

bool __thiscall
netlist::DirectedGraph<(anonymous_namespace)::TestNode,_(anonymous_namespace)::TestEdge>::
getInEdgesToNode(DirectedGraph<(anonymous_namespace)::TestNode,_(anonymous_namespace)::TestEdge>
                 *this,TestNode *targetNode,
                vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
                *results)

{
  bool bVar1;
  byte bVar2;
  vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
  *in_RDX;
  long in_RDI;
  unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>
  *node;
  const_iterator __end0;
  const_iterator __begin0;
  NodeListType *__range2;
  vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
  tempResults;
  vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
  *in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  __normal_iterator<(anonymous_namespace)::TestEdge_**,_std::vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<(anonymous_namespace)::TestEdge_**,_std::vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>_>
  in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>_>
  local_40;
  long local_38;
  vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
  *local_18;
  
  local_18 = in_RDX;
  std::vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
  ::vector((vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
            *)0x20e16b);
  local_38 = in_RDI + 8;
  local_40._M_current =
       (unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>
        *)std::
          vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>
          ::begin((vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>
                   *)in_stack_ffffffffffffff48);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>
  ::end((vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>
         *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>_>
                      ((__normal_iterator<const_std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       (__normal_iterator<const_std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>_>
    ::operator*(&local_40);
    std::
    unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>
    ::operator->((unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>
                  *)0x20e1d3);
    Node<(anonymous_namespace)::TestNode,_(anonymous_namespace)::TestEdge>::getEdgesTo
              ((Node<(anonymous_namespace)::TestNode,_(anonymous_namespace)::TestEdge> *)
               in_stack_ffffffffffffff90._M_current,(TestNode *)in_stack_ffffffffffffff88._M_current
               ,(vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
                 *)in_stack_ffffffffffffff80._M_current);
    in_stack_ffffffffffffff60 = local_18;
    in_stack_ffffffffffffff90 =
         std::
         vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
         ::end(in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::TestEdge*const*,std::vector<(anonymous_namespace)::TestEdge*,std::allocator<(anonymous_namespace)::TestEdge*>>>
    ::__normal_iterator<(anonymous_namespace)::TestEdge**>
              ((__normal_iterator<(anonymous_namespace)::TestEdge_*const_*,_std::vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>_>
                *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (__normal_iterator<(anonymous_namespace)::TestEdge_**,_std::vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>_>
                *)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff88 =
         std::
         vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
         ::begin(in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff80 =
         std::
         vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
         ::end(in_stack_ffffffffffffff48);
    std::vector<(anonymous_namespace)::TestEdge*,std::allocator<(anonymous_namespace)::TestEdge*>>::
    insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::TestEdge**,std::vector<(anonymous_namespace)::TestEdge*,std::allocator<(anonymous_namespace)::TestEdge*>>>,void>
              ((vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
                *)in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::
    vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>::
    clear((vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
           *)0x20e270);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::TestNode,_std::default_delete<(anonymous_namespace)::TestNode>_>_>_>_>
    ::operator++(&local_40);
  }
  bVar1 = std::
          vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
          ::empty(in_stack_ffffffffffffff60);
  bVar2 = bVar1 ^ 0xff;
  std::vector<(anonymous_namespace)::TestEdge_*,_std::allocator<(anonymous_namespace)::TestEdge_*>_>
  ::~vector(in_stack_ffffffffffffff60);
  return (bool)(bVar2 & 1);
}

Assistant:

bool getInEdgesToNode(const NodeType& targetNode, std::vector<EdgeType*>& results) const {
        SLANG_ASSERT(results.empty() && "Expected the results parameter to be empty");
        std::vector<EdgeType*> tempResults;
        for (auto& node : nodes) {
            node->getEdgesTo(targetNode, tempResults);
            results.insert(results.end(), tempResults.begin(), tempResults.end());
            tempResults.clear();
        }
        return !results.empty();
    }